

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10.x = half_sz.x;
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = pos;
  auVar5 = auVar7._0_16_;
  local_18 = (ImVec2)vmovlps_avx(auVar5);
  if (3 < (uint)direction) {
    return;
  }
  auVar1 = vmovshdup_avx(auVar5);
  auVar2._8_4_ = in_XMM1_Dc;
  auVar2._0_8_ = half_sz;
  auVar2._12_4_ = in_XMM1_Dd;
  auVar2 = vmovshdup_avx(auVar2);
  fVar4 = pos.x;
  switch(direction) {
  case 0:
    local_8.y = auVar1._0_4_ - auVar2._0_4_;
    auVar6._0_4_ = local_10.x + fVar4;
    auVar6._4_4_ = half_sz.y + pos.y;
    auVar6._8_4_ = in_XMM1_Dc + in_register_00001208._0_4_;
    auVar6._12_4_ = in_XMM1_Dd + in_register_00001208._4_4_;
    break;
  case 1:
    local_8.y = auVar2._0_4_ + auVar1._0_4_;
    auVar3._8_4_ = in_XMM1_Dc;
    auVar3._0_8_ = half_sz;
    auVar3._12_4_ = in_XMM1_Dd;
    auVar6 = vsubps_avx(auVar5,auVar3);
    break;
  case 2:
    auVar5._0_4_ = local_10.x + fVar4;
    auVar5._4_4_ = half_sz.y + pos.y;
    auVar5._8_4_ = in_XMM1_Dc + in_register_00001208._0_4_;
    auVar5._12_4_ = in_XMM1_Dd + in_register_00001208._4_4_;
    local_8 = (ImVec2)vmovlps_avx(auVar5);
    local_10.x = fVar4 - local_10.x;
    goto LAB_001914c8;
  case 3:
    auVar1._8_4_ = in_XMM1_Dc;
    auVar1._0_8_ = half_sz;
    auVar1._12_4_ = in_XMM1_Dd;
    auVar5 = vsubps_avx(auVar5,auVar1);
    local_8 = (ImVec2)vmovlps_avx(auVar5);
    local_10.x = local_10.x + fVar4;
LAB_001914c8:
    local_10.y = (float)vextractps_avx(auVar5,1);
    goto LAB_001914f9;
  }
  local_8.x = auVar6._0_4_;
  local_10 = (ImVec2)vmovlps_avx(auVar6);
LAB_001914f9:
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}